

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void format(tagval *args,int numargs)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  tagval *ptVar4;
  char *x;
  char *pcVar5;
  vector<char> s;
  stringformatter local_50;
  vector<char> local_48;
  int local_34;
  
  local_48.buf = (char *)0x0;
  local_48.alen = 0;
  local_48.ulen = 0;
  pcVar5 = "";
  local_34 = numargs;
  switch(args->type) {
  case 1:
    retidx = retidx + ((retidx + 1U) / 3) * -3 + 1;
    local_50.buf = retbuf[(uint)retidx];
    stringformatter::operator()(&local_50,"%d",(ulong)(uint)(args->super_identval).field_0.i);
    pcVar5 = retbuf[(uint)retidx];
    break;
  case 2:
    pcVar5 = floatstr((args->super_identval).field_0.f);
    break;
  case 3:
  case 6:
    pcVar5 = (args->super_identval).field_0.s;
  }
  cVar2 = *pcVar5;
  if (cVar2 != '\0') {
    do {
      if (cVar2 == '%') {
        bVar1 = pcVar5[1];
        pcVar5 = pcVar5 + 2;
        if ((byte)(bVar1 - 0x31) < 9) {
          uVar3 = bVar1 - 0x30;
          x = "";
          if ((int)uVar3 < local_34) {
            x = "";
            if (args[uVar3].type - 1U < 6) {
              ptVar4 = args + uVar3;
              x = "";
              switch(args[uVar3].type) {
              case 1:
                retidx = retidx + ((retidx + 1U) / 3) * -3 + 1;
                local_50.buf = retbuf[(uint)retidx];
                stringformatter::operator()
                          (&local_50,"%d",(ulong)(uint)(ptVar4->super_identval).field_0.i);
                x = retbuf[(uint)retidx];
                break;
              case 2:
                x = floatstr((ptVar4->super_identval).field_0.f);
                break;
              default:
                x = (ptVar4->super_identval).field_0.s;
                break;
              case 4:
              case 5:
                break;
              }
            }
          }
          do {
            if (*x == '\0') goto LAB_0012cd0f;
            vector<char>::add(&local_48,x);
            x = x + 1;
          } while( true );
        }
        local_50.buf._0_1_ = bVar1;
        vector<char>::add(&local_48,(char *)&local_50);
      }
      else {
        local_50.buf._0_1_ = cVar2;
        vector<char>::add(&local_48,(char *)&local_50);
        pcVar5 = pcVar5 + 1;
      }
LAB_0012cd0f:
      cVar2 = *pcVar5;
    } while (cVar2 != '\0');
  }
  local_50.buf = local_50.buf & 0xffffffffffffff00;
  vector<char>::add(&local_48,(char *)&local_50);
  result(local_48.buf);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff;
  if (local_48.buf != (char *)0x0) {
    operator_delete__(local_48.buf);
  }
  return;
}

Assistant:

void format(tagval *args, int numargs)
{
    vector<char> s;
    const char *f = args[0].getstr();
    while(*f)
    {
        int c = *f++;
        if(c == '%')
        {
            int i = *f++;
            if(i >= '1' && i <= '9')
            {
                i -= '0';
                const char *sub = i < numargs ? args[i].getstr() : "";
                while(*sub) s.add(*sub++);
            }
            else s.add(i);
        }
        else s.add(c);
    }
    s.add('\0');
    result(s.getbuf());
}